

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderFreeNode(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  xmlNodePtr cur_00;
  _xmlAttr *p_Var1;
  xmlParserCtxtPtr pxVar2;
  xmlAttrPtr cur_01;
  int iVar3;
  xmlElementType xVar4;
  xmlDeregisterNodeFunc *pp_Var5;
  xmlChar *pxVar6;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  xVar4 = cur->type;
  if (xVar4 == XML_ATTRIBUTE_NODE) {
    xmlTextReaderFreeProp(reader,(xmlAttrPtr)cur);
    return;
  }
  if (xVar4 == XML_NAMESPACE_DECL) {
    xmlFreeNs((xmlNsPtr)cur);
    return;
  }
  if (xVar4 == XML_DTD_NODE) {
    xmlFreeDtd((xmlDtdPtr)cur);
    return;
  }
  cur_00 = cur->children;
  if (xVar4 != XML_ENTITY_REF_NODE && cur_00 != (xmlNodePtr)0x0) {
    if (cur_00->parent == cur) {
      xmlTextReaderFreeNodeList(reader,cur_00);
    }
    cur->children = (_xmlNode *)0x0;
  }
  if ((__xmlRegisterCallbacks != 0) &&
     (pp_Var5 = __xmlDeregisterNodeDefaultValue(), *pp_Var5 != (xmlDeregisterNodeFunc)0x0)) {
    pp_Var5 = __xmlDeregisterNodeDefaultValue();
    (**pp_Var5)(cur);
  }
  if ((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
     ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    cur_01 = cur->properties;
    while (cur_01 != (xmlAttrPtr)0x0) {
      p_Var1 = cur_01->next;
      xmlTextReaderFreeProp(reader,cur_01);
      cur_01 = p_Var1;
    }
  }
  pxVar6 = cur->content;
  if ((_xmlAttr **)pxVar6 == &cur->properties) {
LAB_0019b458:
    xVar4 = cur->type;
  }
  else {
    xVar4 = cur->type;
    if (((XML_XINCLUDE_END < xVar4) ||
        ((0x180022U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
       (pxVar6 != (xmlChar *)0x0)) {
      if (dict != (xmlDictPtr)0x0) {
        iVar3 = xmlDictOwns(dict,pxVar6);
        if (iVar3 != 0) goto LAB_0019b458;
        pxVar6 = cur->content;
      }
      (*xmlFree)(pxVar6);
      goto LAB_0019b458;
    }
  }
  if (((xVar4 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
      ((0x180002U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
     (cur->nsDef != (xmlNsPtr)0x0)) {
    xmlFreeNsList(cur->nsDef);
    xVar4 = cur->type;
  }
  if (((xVar4 == XML_TEXT_NODE) || (xVar4 == XML_COMMENT_NODE)) ||
     (pxVar6 = cur->name, pxVar6 == (xmlChar *)0x0)) goto LAB_0019b4b2;
  if (dict == (xmlDictPtr)0x0) {
LAB_0019b4a3:
    (*xmlFree)(pxVar6);
  }
  else {
    iVar3 = xmlDictOwns(dict,pxVar6);
    if (iVar3 == 0) {
      pxVar6 = cur->name;
      goto LAB_0019b4a3;
    }
  }
  xVar4 = cur->type;
LAB_0019b4b2:
  if ((((xVar4 | XML_ATTRIBUTE_NODE) == XML_TEXT_NODE) &&
      (pxVar2 = reader->ctxt, pxVar2 != (xmlParserCtxtPtr)0x0)) &&
     (iVar3 = pxVar2->freeElemsNr, iVar3 < 100)) {
    cur->next = pxVar2->freeElems;
    pxVar2->freeElems = cur;
    pxVar2->freeElemsNr = iVar3 + 1;
    return;
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeNode(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlTextReaderFreeProp(reader, (xmlAttrPtr) cur);
	return;
    }

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	if (cur->children->parent == cur)
	    xmlTextReaderFreeNodeList(reader, cur->children);
	cur->children = NULL;
    }

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->properties != NULL))
	xmlTextReaderFreePropList(reader, cur->properties);
    if ((cur->content != (xmlChar *) &(cur->properties)) &&
        (cur->type != XML_ELEMENT_NODE) &&
	(cur->type != XML_XINCLUDE_START) &&
	(cur->type != XML_XINCLUDE_END) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	DICT_FREE(cur->content);
    }
    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->nsDef != NULL))
	xmlFreeNsList(cur->nsDef);

    /*
     * we don't free names here they are interned now
     */
    if ((cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_TEXT_NODE)) &&
	(reader != NULL) && (reader->ctxt != NULL) &&
	(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	cur->next = reader->ctxt->freeElems;
	reader->ctxt->freeElems = cur;
	reader->ctxt->freeElemsNr++;
    } else {
	xmlFree(cur);
    }
}